

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

ScalarFunction *
duckdb::AddFunction::GetFunction(ScalarFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType varargs;
  LogicalType varargs_00;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe94;
  FunctionNullHandling in_stack_fffffffffffffea0;
  bind_lambda_function_t in_stack_fffffffffffffea8;
  LogicalType local_150;
  scalar_function_t local_138;
  scalar_function_t local_118;
  LogicalType local_f8;
  vector<duckdb::LogicalType,_true> local_e0;
  LogicalType local_c8;
  vector<duckdb::LogicalType,_true> local_b0;
  string local_98;
  string local_78;
  LogicalType local_58;
  LogicalType local_40;
  
  if (type->id_ == DECIMAL) {
    paVar2 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"+","");
    LogicalType::LogicalType(&local_150,type);
    __l._M_len = 1;
    __l._M_array = &local_150;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b0,__l,
               (allocator_type *)&stack0xfffffffffffffeaf);
    LogicalType::LogicalType(&local_c8,type);
    local_118.super__Function_base._M_functor._8_8_ = 0;
    local_118.super__Function_base._M_functor._M_unused._M_function_pointer =
         ScalarFunction::NopFunction;
    local_118._M_invoker =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_invoke;
    local_118.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
    LogicalType::LogicalType(&local_40,INVALID);
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs._0_8_ = &local_40;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffe8c;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffe94;
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_78,&local_b0,&local_c8,&local_118,NopDecimalBind,
               (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
               (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffea8);
    LogicalType::~LogicalType(&local_40);
    if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_118.super__Function_base._M_manager)
                ((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_c8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_b0);
    LogicalType::~LogicalType(&local_150);
    _Var1._M_p = local_78._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"+","");
    LogicalType::LogicalType(&local_150,type);
    __l_00._M_len = 1;
    __l_00._M_array = &local_150;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_e0,__l_00
               ,(allocator_type *)&stack0xfffffffffffffeaf);
    LogicalType::LogicalType(&local_f8,type);
    local_138.super__Function_base._M_functor._8_8_ = 0;
    local_138.super__Function_base._M_functor._M_unused._M_function_pointer =
         ScalarFunction::NopFunction;
    local_138._M_invoker =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_invoke;
    local_138.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
         ::_M_manager;
    LogicalType::LogicalType(&local_58,INVALID);
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
    varargs_00._0_8_ = &local_58;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         in_stack_fffffffffffffe8c;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         0;
    varargs_00.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         in_stack_fffffffffffffe94;
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_98,&local_e0,&local_f8,&local_138,
               (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
               (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
    LogicalType::~LogicalType(&local_58);
    if (local_138.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_138.super__Function_base._M_manager)
                ((_Any_data *)&local_138,(_Any_data *)&local_138,__destroy_functor);
    }
    LogicalType::~LogicalType(&local_f8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_e0);
    LogicalType::~LogicalType(&local_150);
    _Var1._M_p = local_98._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction AddFunction::GetFunction(const LogicalType &type) {
	D_ASSERT(type.IsNumeric());
	if (type.id() == LogicalTypeId::DECIMAL) {
		return ScalarFunction("+", {type}, type, ScalarFunction::NopFunction, NopDecimalBind);
	} else {
		return ScalarFunction("+", {type}, type, ScalarFunction::NopFunction);
	}
}